

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O2

bool __thiscall
Imf_2_5::DwaCompressor::Classifier::match(Classifier *this,string *suffix,PixelType type)

{
  __type _Var1;
  int iVar2;
  size_type sVar3;
  string tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (this->_type == type) {
    if (this->_caseInsensitive != true) {
      _Var1 = std::operator==(suffix,&this->_suffix);
      return _Var1;
    }
    std::__cxx11::string::string((string *)&local_40,(string *)suffix);
    for (sVar3 = 0; local_40._M_string_length != sVar3; sVar3 = sVar3 + 1) {
      iVar2 = tolower((int)local_40._M_dataplus._M_p[sVar3]);
      local_40._M_dataplus._M_p[sVar3] = (char)iVar2;
    }
    _Var1 = std::operator==(&local_40,&this->_suffix);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool match (const std::string &suffix, const PixelType type) const
    {
        if (_type != type) return false;

        if (_caseInsensitive) 
        {
            std::string tmp(suffix);
            std::transform(tmp.begin(), tmp.end(), tmp.begin(), tolower);
            return tmp == _suffix;
        }

        return suffix == _suffix;
    }